

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O3

int Abc_TtMinBase(word *pTruth,int *pVars,int nVars,int nVarsAll)

{
  word *pwVar1;
  ulong uVar2;
  word wVar3;
  uint uVar4;
  byte bVar5;
  byte bVar6;
  word *pwVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  word *pwVar14;
  ulong uVar15;
  word *pwVar16;
  word *pwVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  word *pwVar21;
  long lVar22;
  ulong uVar23;
  word *pLimit;
  
  if (nVarsAll < nVars) {
    __assert_fail("nVars <= nVarsAll",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                  ,0x75b,"int Abc_TtMinBase(word *, int *, int, int)");
  }
  if (nVars < 1) {
    uVar9 = 0;
  }
  else {
    iVar11 = nVarsAll + -6;
    uVar4 = 1 << ((byte)iVar11 & 0x1f);
    pwVar1 = pTruth + (int)uVar4;
    if ((int)uVar4 < 2) {
      uVar4 = 1;
    }
    uVar20 = 0;
    uVar9 = 0;
    do {
      bVar5 = (byte)uVar20;
      if (nVarsAll < 7) {
        if ((s_Truths6Neg[uVar20] & (*pTruth >> ((byte)(1 << (bVar5 & 0x1f)) & 0x3f) ^ *pTruth)) !=
            0) {
LAB_007847a4:
          iVar12 = (int)uVar9;
          lVar10 = (long)iVar12;
          if (lVar10 < (long)uVar20) {
            if (pVars != (int *)0x0) {
              pVars[lVar10] = pVars[uVar20];
            }
            if (uVar20 != uVar9) {
              bVar6 = (byte)uVar9;
              if (nVarsAll < 7) {
                uVar9 = *pTruth;
                bVar5 = (char)(-1 << (bVar6 & 0x1f)) + (char)(1 << (bVar5 & 0x1f));
                *pTruth = (uVar9 & *(ulong *)(lVar10 * 0x90 + 0xa4dd20 + uVar20 * 0x18)) >>
                          (bVar5 & 0x3f) |
                          (*(ulong *)(lVar10 * 0x90 + 0xa4dd18 + uVar20 * 0x18) & uVar9) <<
                          (bVar5 & 0x3f) | s_PPMasks[lVar10][uVar20][0] & uVar9;
              }
              else if (uVar20 < 6) {
                if (iVar11 != 0x1f) {
                  bVar5 = (char)(1 << (bVar5 & 0x1f)) + (char)(-1 << (bVar6 & 0x1f));
                  uVar9 = s_PPMasks[lVar10][uVar20][0];
                  uVar23 = *(ulong *)(lVar10 * 0x90 + 0xa4dd18 + uVar20 * 0x18);
                  uVar18 = *(ulong *)(lVar10 * 0x90 + 0xa4dd20 + uVar20 * 0x18);
                  uVar15 = 0;
                  do {
                    uVar2 = pTruth[uVar15];
                    pTruth[uVar15] =
                         (uVar2 & uVar18) >> (bVar5 & 0x3f) |
                         (uVar2 & uVar23) << (bVar5 & 0x3f) | uVar2 & uVar9;
                    uVar15 = uVar15 + 1;
                  } while (uVar4 != uVar15);
                }
              }
              else if (iVar12 < 6) {
                if (iVar11 != 0x1f) {
                  bVar5 = (byte)(uVar20 - 6);
                  uVar8 = 1 << (bVar5 & 0x1f);
                  iVar13 = 2 << (bVar5 & 0x1f);
                  uVar9 = 1;
                  if (1 < (int)uVar8) {
                    uVar9 = (ulong)uVar8;
                  }
                  pwVar7 = pTruth + (int)uVar8;
                  pwVar16 = pTruth;
                  do {
                    if (uVar20 - 6 != 0x1f) {
                      uVar23 = s_Truths6[lVar10];
                      uVar18 = 0;
                      do {
                        uVar15 = pwVar16[uVar18];
                        bVar5 = (byte)(1 << (bVar6 & 0x1f));
                        uVar2 = pwVar7[uVar18];
                        pwVar16[uVar18] = uVar15 & ~uVar23 | uVar2 << (bVar5 & 0x3f) & uVar23;
                        pwVar7[uVar18] = uVar2 & uVar23 | (uVar15 & uVar23) >> (bVar5 & 0x3f);
                        uVar18 = uVar18 + 1;
                      } while (uVar9 != uVar18);
                    }
                    pwVar16 = pwVar16 + iVar13;
                    pwVar7 = pwVar7 + iVar13;
                  } while (pwVar16 < pwVar1);
                }
              }
              else if (iVar11 != 0x1f) {
                bVar5 = (byte)(uVar20 - 6);
                bVar6 = (byte)(iVar12 + -6);
                uVar8 = 1 << (bVar6 & 0x1f);
                iVar13 = 2 << (bVar5 & 0x1f);
                uVar9 = 1;
                if (1 < (int)uVar8) {
                  uVar9 = (ulong)uVar8;
                }
                lVar22 = (long)(2 << (bVar6 & 0x1f));
                lVar10 = (long)(1 << (bVar5 & 0x1f));
                pwVar7 = pTruth + lVar10;
                pwVar16 = pTruth + (int)uVar8;
                pwVar14 = pTruth;
                do {
                  if (uVar20 - 6 != 0x1f) {
                    lVar19 = 0;
                    pwVar17 = pwVar7;
                    pwVar21 = pwVar16;
                    do {
                      if (iVar12 + -6 != 0x1f) {
                        uVar23 = 0;
                        do {
                          wVar3 = pwVar21[uVar23];
                          pwVar21[uVar23] = pwVar17[uVar23];
                          pwVar17[uVar23] = wVar3;
                          uVar23 = uVar23 + 1;
                        } while (uVar9 != uVar23);
                      }
                      lVar19 = lVar19 + lVar22;
                      pwVar17 = pwVar17 + lVar22;
                      pwVar21 = pwVar21 + lVar22;
                    } while (lVar19 < lVar10);
                  }
                  pwVar14 = pwVar14 + iVar13;
                  pwVar7 = pwVar7 + iVar13;
                  pwVar16 = pwVar16 + iVar13;
                } while (pwVar14 < pwVar1);
              }
            }
          }
          uVar9 = (ulong)(iVar12 + 1);
        }
      }
      else if (uVar20 < 6) {
        if (iVar11 != 0x1f) {
          uVar23 = 0;
          do {
            if (((pTruth[uVar23] >> ((byte)(1 << (bVar5 & 0x1f)) & 0x3f) ^ pTruth[uVar23]) &
                s_Truths6Neg[uVar20]) != 0) goto LAB_007847a4;
            uVar23 = uVar23 + 1;
          } while (uVar4 != uVar23);
        }
      }
      else if (iVar11 != 0x1f) {
        bVar6 = (byte)(uVar20 - 6);
        uVar8 = 1 << (bVar6 & 0x1f);
        iVar12 = 2 << (bVar6 & 0x1f);
        uVar23 = 1;
        if (1 < (int)uVar8) {
          uVar23 = (ulong)uVar8;
        }
        pwVar7 = pTruth + (int)uVar8;
        pwVar16 = pTruth;
        do {
          if (uVar20 - 6 != 0x1f) {
            uVar18 = 0;
            do {
              if (pwVar16[uVar18] != pwVar7[uVar18]) goto LAB_007847a4;
              uVar18 = uVar18 + 1;
            } while (uVar23 != uVar18);
          }
          pwVar16 = pwVar16 + iVar12;
          pwVar7 = pwVar7 + iVar12;
        } while (pwVar16 < pwVar1);
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != (uint)nVars);
  }
  if (nVars < (int)uVar9) {
    __assert_fail("k < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                  ,0x769,"int Abc_TtMinBase(word *, int *, int, int)");
  }
  return (int)uVar9;
}

Assistant:

static inline int Abc_TtMinBase( word * pTruth, int * pVars, int nVars, int nVarsAll ) 
{
    int i, k;
    assert( nVars <= nVarsAll );
    for ( i = k = 0; i < nVars; i++ )
    {
        if ( !Abc_TtHasVar( pTruth, nVarsAll, i ) )
            continue;
        if ( k < i )
        {
            if ( pVars ) pVars[k] = pVars[i];
            Abc_TtSwapVars( pTruth, nVarsAll, k, i );
        }
        k++;
    }
    if ( k == nVars )
        return k;
    assert( k < nVars );
//    assert( k == Abc_TtSupportSize(pTruth, nVars) );
    return k;
}